

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * utext_setup_63(UText *ut,int32_t extraSpace,UErrorCode *status)

{
  UBool UVar1;
  void *pvVar2;
  int local_2c;
  int32_t spaceRequired;
  UErrorCode *status_local;
  UText *pUStack_18;
  int32_t extraSpace_local;
  UText *ut_local;
  
  UVar1 = U_FAILURE(*status);
  ut_local = ut;
  if (UVar1 == '\0') {
    if (ut == (UText *)0x0) {
      local_2c = 0x90;
      if (0 < extraSpace) {
        local_2c = extraSpace + 0x90;
      }
      pUStack_18 = (UText *)uprv_malloc_63((long)local_2c);
      if (pUStack_18 == (UText *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return (UText *)0x0;
      }
      memcpy(pUStack_18,&emptyText,0x90);
      pUStack_18->flags = pUStack_18->flags | 1;
      if (0 < local_2c) {
        pUStack_18->extraSize = extraSpace;
        pUStack_18->pExtra = pUStack_18 + 1;
      }
    }
    else {
      if (ut->magic != 0x345ad82c) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return ut;
      }
      if (((ut->flags & 4U) != 0) && (ut->pFuncs->close != (UTextClose *)0x0)) {
        (*ut->pFuncs->close)(ut);
      }
      ut->flags = ut->flags & 0xfffffffb;
      pUStack_18 = ut;
      if (ut->extraSize < extraSpace) {
        if ((ut->flags & 2U) != 0) {
          uprv_free_63(ut->pExtra);
          ut->extraSize = 0;
        }
        pvVar2 = uprv_malloc_63((long)extraSpace);
        ut->pExtra = pvVar2;
        if (ut->pExtra == (void *)0x0) {
          *status = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          ut->extraSize = extraSpace;
          ut->flags = ut->flags | 2;
        }
      }
    }
    UVar1 = U_SUCCESS(*status);
    if (UVar1 != '\0') {
      pUStack_18->flags = pUStack_18->flags | 4;
      pUStack_18->context = (void *)0x0;
      pUStack_18->chunkContents = (UChar *)0x0;
      pUStack_18->p = (void *)0x0;
      pUStack_18->q = (void *)0x0;
      pUStack_18->r = (void *)0x0;
      pUStack_18->a = 0;
      pUStack_18->b = 0;
      pUStack_18->c = 0;
      pUStack_18->chunkOffset = 0;
      pUStack_18->chunkLength = 0;
      pUStack_18->chunkNativeStart = 0;
      pUStack_18->chunkNativeLimit = 0;
      pUStack_18->nativeIndexingLimit = 0;
      pUStack_18->providerProperties = 0;
      pUStack_18->privA = 0;
      pUStack_18->privB = 0;
      pUStack_18->privC = 0;
      pUStack_18->privP = (void *)0x0;
      if ((pUStack_18->pExtra != (void *)0x0) && (0 < pUStack_18->extraSize)) {
        memset(pUStack_18->pExtra,0,(long)pUStack_18->extraSize);
      }
    }
    ut_local = pUStack_18;
  }
  return ut_local;
}

Assistant:

U_CAPI UText * U_EXPORT2
utext_setup(UText *ut, int32_t extraSpace, UErrorCode *status) {
    if (U_FAILURE(*status)) {
        return ut;
    }

    if (ut == NULL) {
        // We need to heap-allocate storage for the new UText
        int32_t spaceRequired = sizeof(UText);
        if (extraSpace > 0) {
            spaceRequired = sizeof(ExtendedUText) + extraSpace - sizeof(UAlignedMemory);
        }
        ut = (UText *)uprv_malloc(spaceRequired);
        if (ut == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        } else {
            *ut = emptyText;
            ut->flags |= UTEXT_HEAP_ALLOCATED;
            if (spaceRequired>0) {
                ut->extraSize = extraSpace;
                ut->pExtra    = &((ExtendedUText *)ut)->extension;
            }
        }
    } else {
        // We have been supplied with an already existing UText.
        // Verify that it really appears to be a UText.
        if (ut->magic != UTEXT_MAGIC) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            return ut;
        }
        // If the ut is already open and there's a provider supplied close
        //   function, call it.
        if ((ut->flags & UTEXT_OPEN) && ut->pFuncs->close != NULL)  {
            ut->pFuncs->close(ut);
        }
        ut->flags &= ~UTEXT_OPEN;

        // If extra space was requested by our caller, check whether
        //   sufficient already exists, and allocate new if needed.
        if (extraSpace > ut->extraSize) {
            // Need more space.  If there is existing separately allocated space,
            //   delete it first, then allocate new space.
            if (ut->flags & UTEXT_EXTRA_HEAP_ALLOCATED) {
                uprv_free(ut->pExtra);
                ut->extraSize = 0;
            }
            ut->pExtra = uprv_malloc(extraSpace);
            if (ut->pExtra == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
            } else {
                ut->extraSize = extraSpace;
                ut->flags |= UTEXT_EXTRA_HEAP_ALLOCATED;
            }
        }
    }
    if (U_SUCCESS(*status)) {
        ut->flags |= UTEXT_OPEN;

        // Initialize all remaining fields of the UText.
        //
        ut->context             = NULL;
        ut->chunkContents       = NULL;
        ut->p                   = NULL;
        ut->q                   = NULL;
        ut->r                   = NULL;
        ut->a                   = 0;
        ut->b                   = 0;
        ut->c                   = 0;
        ut->chunkOffset         = 0;
        ut->chunkLength         = 0;
        ut->chunkNativeStart    = 0;
        ut->chunkNativeLimit    = 0;
        ut->nativeIndexingLimit = 0;
        ut->providerProperties  = 0;
        ut->privA               = 0;
        ut->privB               = 0;
        ut->privC               = 0;
        ut->privP               = NULL;
        if (ut->pExtra!=NULL && ut->extraSize>0)
            uprv_memset(ut->pExtra, 0, ut->extraSize);

    }
    return ut;
}